

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall KDIS::NETWORK::Connection::~Connection(Connection *this)

{
  PDU_Factory *this_00;
  int in_EDX;
  int in_ESI;
  Connection *this_local;
  
  this->_vptr_Connection = (_func_int **)&PTR__Connection_0032ab80;
  shutdown(this,in_ESI,in_EDX);
  this_00 = this->m_pPduFact;
  if (this_00 != (PDU_Factory *)0x0) {
    UTILS::PDU_Factory::~PDU_Factory(this_00);
    operator_delete(this_00,0x20);
  }
  std::__cxx11::string::~string((string *)&this->m_sLastIP);
  KDataStream::~KDataStream(&this->m_stream);
  std::
  vector<KDIS::NETWORK::ConnectionSubscriber_*,_std::allocator<KDIS::NETWORK::ConnectionSubscriber_*>_>
  ::~vector(&this->m_vpSubscribers);
  std::__cxx11::string::~string((string *)&this->m_sSendAddress);
  return;
}

Assistant:

Connection::~Connection()
{
    shutdown();
    delete m_pPduFact;
}